

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyFrom
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FileOptions_OptimizeMode FVar2;
  char *format_00;
  Formatter format;
  Formatter local_58;
  
  pDVar1 = this->descriptor_;
  FVar2 = GetOptimizeFor(*(FileDescriptor **)(pDVar1 + 0x10),&this->options_,(bool *)0x0);
  if (((FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar1 + 0x78) != 0)) ||
     (*(int *)(pDVar1 + 4) != 0)) {
    local_58.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_58.vars_._M_t,&(this->variables_)._M_t);
    GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_,(bool *)0x0);
    Formatter::operator()<>
              (&local_58,
               "void $classname$::CopyFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_copy_from_start:$full_name$)\n"
              );
    io::Printer::Indent(local_58.printer_);
    Formatter::operator()<>(&local_58,"if (&from == this) return;\n");
    format_00 = 
    "#ifndef NDEBUG\nsize_t from_size = from.ByteSizeLong();\n#endif\nClear();\n#ifndef NDEBUG\n$CHK$_EQ(from_size, from.ByteSizeLong())\n  << \"Source of CopyFrom changed when clearing target.  Either \"\n     \"source is a nested message in target (not allowed), or \"\n     \"another thread is modifying the source.\";\n#endif\n"
    ;
    if ((this->options_).opensource_runtime != false) {
      format_00 = "Clear();\n";
    }
    Formatter::operator()<>(&local_58,format_00);
    Formatter::operator()<>(&local_58,"MergeFrom(from);\n");
    io::Printer::Outdent(local_58.printer_);
    Formatter::operator()<>(&local_58,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_58.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCopyFrom(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // We don't override the generalized CopyFrom (aka that which
    // takes in the Message base class as a parameter); instead we just
    // let the base Message::CopyFrom take care of it.  The base MergeFrom
    // knows how to quickly confirm the types exactly match, and if so, will
    // use GetClassData() to get the address of Message::CopyWithSizeCheck,
    // which calls Clear() and then MergeFrom(), as well as making sure that
    // clearing the destination message doesn't alter the size of the source,
    // when in debug builds.
    // Most callers avoid this by passing a "from" message that is the same
    // type as the message being merged into, rather than a generic Message.
  }

  // Generate the class-specific CopyFrom.
  format(
      "void $classname$::CopyFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_copy_from_start:"
      "$full_name$)\n");
  format.Indent();

  format("if (&from == this) return;\n");

  if (!options_.opensource_runtime) {
    // This check is disabled in the opensource release because we're
    // concerned that many users do not define NDEBUG in their release builds.
    format(
        "#ifndef NDEBUG\n"
        "size_t from_size = from.ByteSizeLong();\n"
        "#endif\n"
        "Clear();\n"
        "#ifndef NDEBUG\n"
        "$CHK$_EQ(from_size, from.ByteSizeLong())\n"
        "  << \"Source of CopyFrom changed when clearing target.  Either \"\n"
        "     \"source is a nested message in target (not allowed), or \"\n"
        "     \"another thread is modifying the source.\";\n"
        "#endif\n");
  } else {
    format("Clear();\n");
  }
  format("MergeFrom(from);\n");

  format.Outdent();
  format("}\n");
}